

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O2

bool __thiscall
ON_Viewport::GetPointDepth(ON_Viewport *this,ON_3dPoint point,double *view_plane_depth)

{
  double dVar1;
  double dVar2;
  ON_3dVector local_30;
  
  dVar1 = point.x;
  if ((point.x != -1.23432101234321e+308) || (NAN(point.x))) {
    ON_3dPoint::operator-(&local_30,&this->m_CamLoc,&point);
    dVar2 = ON_3dVector::operator*(&local_30,&this->m_CamZ);
    if (view_plane_depth != (double *)0x0) {
      *view_plane_depth = dVar2;
    }
  }
  return (bool)(-(dVar1 != -1.23432101234321e+308) & 1);
}

Assistant:

bool ON_Viewport::GetPointDepth(       
       ON_3dPoint point,
       double* view_plane_depth
       ) const
{
  bool rc = false;
  if ( point.x != ON_UNSET_VALUE )
  {
    double depth = (m_CamLoc - point)*m_CamZ;
    if ( 0 != view_plane_depth )
      *view_plane_depth = depth;
    rc = true;
  }
  return rc;
}